

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cpp
# Opt level: O3

void __thiscall Bind::Bind(Bind *this,BindData *bind_data)

{
  value_type *local_20;
  
  local_20 = (bind_data->inside_).data_;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&this->inside_,&local_20,auto_format);
  local_20 = (bind_data->outside_).data_;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&this->outside_,&local_20,auto_format);
  this->flags_ = bind_data->flags_;
  this->mounted_ = false;
  std::filesystem::__cxx11::path::path(&this->from_);
  std::filesystem::__cxx11::path::path(&this->to_);
  return;
}

Assistant:

Bind::Bind(const BindData *bind_data)
    : inside_(bind_data->inside_.c_str()), outside_(bind_data->outside_.c_str()), flags_(bind_data->flags_) {}